

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

void __thiscall
duckdb::HashJoinGlobalSinkState::HashJoinGlobalSinkState
          (HashJoinGlobalSinkState *this,PhysicalHashJoin *op_p,ClientContext *context_p)

{
  unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>,_true>
  *this_00;
  PhysicalHashJoin *pPVar1;
  _Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  __ptr_00;
  _Head_base<0UL,_duckdb::JoinFilterGlobalState_*,_false> this_01;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  RETURN_TYPE RVar5;
  int32_t val;
  TaskScheduler *this_02;
  unsigned_long uVar6;
  ClientContext *pCVar7;
  type ht_p;
  _Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  this_03;
  const_reference pvVar8;
  pointer pBVar9;
  type pBVar10;
  pointer this_04;
  const_reference pvVar11;
  pointer pJVar12;
  pointer *__ptr_1;
  pointer __p;
  pointer *__ptr;
  undefined1 local_b0 [128];
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__HashJoinGlobalSinkState_0246acd8;
  this->context = context_p;
  this->op = op_p;
  this_02 = TaskScheduler::GetScheduler(context_p);
  val = TaskScheduler::NumberOfThreads(this_02);
  uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  this->num_threads = uVar6;
  pCVar7 = (ClientContext *)TemporaryMemoryManager::Get(this->context);
  TemporaryMemoryManager::Register((TemporaryMemoryManager *)&this->temporary_memory_state,pCVar7);
  this_00 = &this->perfect_join_executor;
  (this->active_local_states).super___atomic_base<unsigned_long>._M_i = 0;
  (this->global_filter_state).
  super_unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::JoinFilterGlobalState_*,_std::default_delete<duckdb::JoinFilterGlobalState>_>
  .super__Head_base<0UL,_duckdb::JoinFilterGlobalState_*,_false>._M_head_impl =
       (JoinFilterGlobalState *)0x0;
  (this->hash_table).
  super_unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>._M_t.
  super___uniq_ptr_impl<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::JoinHashTable_*,_std::default_delete<duckdb::JoinHashTable>_>.
  super__Head_base<0UL,_duckdb::JoinHashTable_*,_false>._M_head_impl = (JoinHashTable *)0x0;
  (this->perfect_join_executor).
  super_unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  .super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl =
       (PerfectHashJoinExecutor *)0x0;
  this->finalized = false;
  this->total_size = 0;
  this->max_partition_size = 0;
  this->max_partition_count = 0;
  this->probe_side_requirement = 0;
  (this->local_hash_tables).
  super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->local_hash_tables).
  super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->local_hash_tables).
  super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->probe_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->probe_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->probe_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->probe_types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->probe_spill).
           super_unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::JoinHashTable::ProbeSpill_*,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
           .super__Head_base<0UL,_duckdb::JoinHashTable::ProbeSpill_*,_false> + 2) = 0;
  PhysicalHashJoin::InitializeHashTable((PhysicalHashJoin *)local_b0,(ClientContext *)this->op);
  uVar2 = local_b0._0_8_;
  local_b0._0_8_ = (JoinHashTable *)0x0;
  ::std::__uniq_ptr_impl<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>::reset
            ((__uniq_ptr_impl<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_> *)
             &this->hash_table,(pointer)uVar2);
  uVar2 = local_b0._0_8_;
  if ((JoinHashTable *)local_b0._0_8_ != (JoinHashTable *)0x0) {
    JoinHashTable::~JoinHashTable((JoinHashTable *)local_b0._0_8_);
    operator_delete((void *)uVar2);
  }
  pPVar1 = this->op;
  ht_p = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
         operator*(&this->hash_table);
  this_03.super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>)operator_new(200);
  PerfectHashJoinExecutor::PerfectHashJoinExecutor
            ((PerfectHashJoinExecutor *)
             this_03.super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl,
             pPVar1,ht_p);
  local_b0._0_8_ = (PerfectHashJoinExecutor *)0x0;
  __ptr_00.super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
       .super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>;
  (this_00->
  super_unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  .super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false> =
       this_03.super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl;
  if (__ptr_00.super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl !=
      (PerfectHashJoinExecutor *)0x0) {
    ::std::default_delete<duckdb::PerfectHashJoinExecutor>::operator()
              ((default_delete<duckdb::PerfectHashJoinExecutor> *)this_00,
               (PerfectHashJoinExecutor *)
               __ptr_00.super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl
              );
    if ((PerfectHashJoinExecutor *)local_b0._0_8_ != (PerfectHashJoinExecutor *)0x0) {
      ::std::default_delete<duckdb::PerfectHashJoinExecutor>::operator()
                ((default_delete<duckdb::PerfectHashJoinExecutor> *)local_b0,
                 (PerfectHashJoinExecutor *)local_b0._0_8_);
    }
  }
  pPVar1 = this->op;
  bVar4 = true;
  if (((long)(pPVar1->super_PhysicalComparisonJoin).conditions.
             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(pPVar1->super_PhysicalComparisonJoin).conditions.
             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
             _M_impl.super__Vector_impl_data._M_start == 0x18) &&
     ((pPVar1->join_stats).
      super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pPVar1->join_stats).
      super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
             ::operator[](&pPVar1->join_stats,1);
    if ((pvVar8->
        super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)._M_t
        .super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
        .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl !=
        (BaseStatistics *)0x0) {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
               ::operator[](&this->op->join_stats,1);
      pBVar9 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
               ::operator->(pvVar8);
      bVar3 = TypeIsIntegral((pBVar9->type).physical_type_);
      if (bVar3) {
        pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                 ::operator[](&this->op->join_stats,1);
        pBVar10 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  ::operator*(pvVar8);
        bVar3 = NumericStats::HasMinMax(pBVar10);
        if (bVar3) {
          this_04 = unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>,_true>
                    ::operator->(this_00);
          pPVar1 = this->op;
          pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                   ::operator[](&pPVar1->join_stats,1);
          pBVar10 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    ::operator*(pvVar8);
          NumericStats::Min((Value *)local_b0,pBVar10);
          pvVar8 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                   ::operator[](&this->op->join_stats,1);
          pBVar10 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    ::operator*(pvVar8);
          NumericStats::Max((Value *)(local_b0 + 0x40),pBVar10);
          bVar4 = PerfectHashJoinExecutor::CanDoPerfectHashJoin
                            (this_04,pPVar1,(Value *)local_b0,(Value *)(local_b0 + 0x40));
          Value::~Value((Value *)(local_b0 + 0x40));
          Value::~Value((Value *)local_b0);
          bVar4 = !bVar4;
        }
      }
    }
  }
  ClientConfig::GetConfig(this->context);
  RVar5 = ClientConfig::GetSetting<duckdb::DebugForceExternalSetting>(this->context);
  this->external = RVar5;
  pvVar11 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                      (&(this->op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                        super_CachingPhysicalOperator.super_PhysicalOperator.children,0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&this->probe_types
             ,&(pvVar11->_M_data->types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&this->probe_types,
             &LogicalType::HASH);
  if ((this->op->super_PhysicalComparisonJoin).filter_pushdown.
      super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl !=
      (JoinFilterPushdownInfo *)0x0) {
    pJVar12 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
              ::operator->(&(this->op->super_PhysicalComparisonJoin).filter_pushdown);
    if (!bVar4 && (pJVar12->probe_info).
                  super_vector<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
                  .
                  super__Vector_base<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (pJVar12->probe_info).
                  super_vector<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
                  .
                  super__Vector_base<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      this->skip_filter_pushdown = true;
    }
    pCVar7 = (ClientContext *)
             unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
             ::operator->(&(this->op->super_PhysicalComparisonJoin).filter_pushdown);
    JoinFilterPushdownInfo::GetGlobalState
              ((JoinFilterPushdownInfo *)local_b0,pCVar7,(PhysicalOperator *)this->context);
    uVar2 = local_b0._0_8_;
    local_b0._0_8_ = (JoinFilterGlobalState *)0x0;
    this_01._M_head_impl =
         (this->global_filter_state).
         super_unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::JoinFilterGlobalState_*,_std::default_delete<duckdb::JoinFilterGlobalState>_>
         .super__Head_base<0UL,_duckdb::JoinFilterGlobalState_*,_false>._M_head_impl;
    (this->global_filter_state).
    super_unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::JoinFilterGlobalState_*,_std::default_delete<duckdb::JoinFilterGlobalState>_>
    .super__Head_base<0UL,_duckdb::JoinFilterGlobalState_*,_false>._M_head_impl =
         (JoinFilterGlobalState *)uVar2;
    if (this_01._M_head_impl != (JoinFilterGlobalState *)0x0) {
      JoinFilterGlobalState::~JoinFilterGlobalState(this_01._M_head_impl);
      operator_delete(this_01._M_head_impl);
      uVar2 = local_b0._0_8_;
      if ((JoinFilterGlobalState *)local_b0._0_8_ != (JoinFilterGlobalState *)0x0) {
        JoinFilterGlobalState::~JoinFilterGlobalState((JoinFilterGlobalState *)local_b0._0_8_);
        operator_delete((void *)uVar2);
      }
    }
  }
  return;
}

Assistant:

HashJoinGlobalSinkState(const PhysicalHashJoin &op_p, ClientContext &context_p)
	    : context(context_p), op(op_p),
	      num_threads(NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads())),
	      temporary_memory_state(TemporaryMemoryManager::Get(context).Register(context)), finalized(false),
	      active_local_states(0), total_size(0), max_partition_size(0), max_partition_count(0),
	      probe_side_requirement(0), scanned_data(false) {
		hash_table = op.InitializeHashTable(context);

		// For perfect hash join
		perfect_join_executor = make_uniq<PerfectHashJoinExecutor>(op, *hash_table);
		bool use_perfect_hash = false;
		if (op.conditions.size() == 1 && !op.join_stats.empty() && op.join_stats[1] &&
		    TypeIsIntegral(op.join_stats[1]->GetType().InternalType()) && NumericStats::HasMinMax(*op.join_stats[1])) {
			use_perfect_hash = perfect_join_executor->CanDoPerfectHashJoin(op, NumericStats::Min(*op.join_stats[1]),
			                                                               NumericStats::Max(*op.join_stats[1]));
		}
		// For external hash join
		external = ClientConfig::GetConfig(context).GetSetting<DebugForceExternalSetting>(context);
		// Set probe types
		probe_types = op.children[0].get().GetTypes();
		probe_types.emplace_back(LogicalType::HASH);

		if (op.filter_pushdown) {
			if (op.filter_pushdown->probe_info.empty() && use_perfect_hash) {
				// Only computing min/max to check for perfect HJ, but we already can
				skip_filter_pushdown = true;
			}
			global_filter_state = op.filter_pushdown->GetGlobalState(context, op);
		}
	}